

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O3

string * __thiscall
zstr::Exception::error_to_message_abi_cxx11_
          (string *__return_storage_ptr__,Exception *this,z_stream *zstrm_p,int ret)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  bool bVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  undefined4 in_register_0000000c;
  ulong *puVar7;
  long *plVar8;
  ulong uVar9;
  char cVar10;
  ulong uVar11;
  string __str_2;
  string __str_3;
  string __str_1;
  string __str;
  ostringstream oss;
  long *local_310;
  long local_308;
  long local_300;
  long lStack_2f8;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  ulong *local_2b0;
  uint local_2a8;
  undefined4 uStack_2a4;
  ulong local_2a0 [2];
  ulong *local_290;
  long local_288;
  ulong local_280;
  long lStack_278;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  ulong *local_250;
  uint local_248;
  undefined4 uStack_244;
  ulong local_240 [2];
  ulong *local_230;
  uint local_228;
  undefined4 uStack_224;
  ulong local_220 [2];
  ulong *local_210;
  long local_208;
  ulong local_200;
  long lStack_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  char *local_1c8;
  uint local_1c0;
  char local_1b8 [16];
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"zlib: ","",CONCAT44(in_register_0000000c,ret));
  local_1f0 = paVar1;
  if ((int)zstrm_p + 6U < 5) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::operator<<(&local_1a8,(int)zstrm_p);
    std::__cxx11::stringbuf::str();
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,0x3bf1fe);
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_2e0 = *puVar7;
      lStack_2d8 = plVar5[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0 = *puVar7;
      local_2f0 = (ulong *)*plVar5;
    }
    local_2e8 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_300 = *plVar8;
      lStack_2f8 = plVar5[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *plVar8;
      local_310 = (long *)*plVar5;
    }
    local_308 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_310);
    if (local_310 != &local_300) {
      operator_delete(local_310);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0);
    }
    if (local_2d0 != &local_2c0) {
      operator_delete(local_2d0);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if (*(long *)&this[1].field_0x10 != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  uVar11 = *(ulong *)this;
  cVar10 = '\x01';
  if (9 < uVar11) {
    uVar9 = uVar11;
    cVar4 = '\x04';
    do {
      cVar10 = cVar4;
      if (uVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_001e0858;
      }
      if (uVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_001e0858;
      }
      if (uVar9 < 10000) goto LAB_001e0858;
      bVar3 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar4 = cVar10 + '\x04';
    } while (bVar3);
    cVar10 = cVar10 + '\x01';
  }
LAB_001e0858:
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct((ulong)&local_1c8,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_1c8,local_1c0,uVar11);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x3be241);
  local_1e8 = &local_1d8;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_1d8 = *plVar8;
    lStack_1d0 = plVar5[3];
  }
  else {
    local_1d8 = *plVar8;
    local_1e8 = (long *)*plVar5;
  }
  local_1e0 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_280 = *puVar7;
    lStack_278 = plVar5[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *puVar7;
    local_290 = (ulong *)*plVar5;
  }
  local_288 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar11 = (ulong)*(uint *)&this->field_0x8;
  cVar10 = '\x01';
  if (9 < uVar11) {
    uVar9 = uVar11;
    cVar4 = '\x04';
    do {
      cVar10 = cVar4;
      if (uVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_001e09ba;
      }
      if (uVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_001e09ba;
      }
      if (uVar9 < 10000) goto LAB_001e09ba;
      bVar3 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar4 = cVar10 + '\x04';
    } while (bVar3);
    cVar10 = cVar10 + '\x01';
  }
LAB_001e09ba:
  local_230 = local_220;
  std::__cxx11::string::_M_construct((ulong)&local_230,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_230,local_228,uVar11);
  uVar11 = CONCAT44(uStack_224,local_228) + local_288;
  uVar9 = 0xf;
  if (local_290 != &local_280) {
    uVar9 = local_280;
  }
  if (uVar9 < uVar11) {
    uVar9 = 0xf;
    if (local_230 != local_220) {
      uVar9 = local_220[0];
    }
    if (uVar9 < uVar11) goto LAB_001e0a40;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_290);
  }
  else {
LAB_001e0a40:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_230);
  }
  local_270 = &local_260;
  puVar2 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar2) {
    local_260 = *puVar2;
    uStack_258 = puVar6[3];
  }
  else {
    local_260 = *puVar2;
    local_270 = (undefined8 *)*puVar6;
  }
  local_268 = puVar6[1];
  *puVar6 = puVar2;
  puVar6[1] = 0;
  *(undefined1 *)puVar2 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_270);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_200 = *puVar7;
    lStack_1f8 = plVar5[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *puVar7;
    local_210 = (ulong *)*plVar5;
  }
  local_208 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar11 = *(ulong *)&this->field_0x18;
  cVar10 = '\x01';
  if (9 < uVar11) {
    uVar9 = uVar11;
    cVar4 = '\x04';
    do {
      cVar10 = cVar4;
      if (uVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_001e0b79;
      }
      if (uVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_001e0b79;
      }
      if (uVar9 < 10000) goto LAB_001e0b79;
      bVar3 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar4 = cVar10 + '\x04';
    } while (bVar3);
    cVar10 = cVar10 + '\x01';
  }
LAB_001e0b79:
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct((ulong)&local_2b0,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2b0,local_2a8,uVar11);
  uVar11 = CONCAT44(uStack_2a4,local_2a8) + local_208;
  uVar9 = 0xf;
  if (local_210 != &local_200) {
    uVar9 = local_200;
  }
  if (uVar9 < uVar11) {
    uVar9 = 0xf;
    if (local_2b0 != local_2a0) {
      uVar9 = local_2a0[0];
    }
    if (uVar9 < uVar11) goto LAB_001e0bef;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_210);
  }
  else {
LAB_001e0bef:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_2b0);
  }
  local_2d0 = &local_2c0;
  puVar2 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar2) {
    local_2c0 = *puVar2;
    uStack_2b8 = puVar6[3];
  }
  else {
    local_2c0 = *puVar2;
    local_2d0 = (undefined8 *)*puVar6;
  }
  local_2c8 = puVar6[1];
  *puVar6 = puVar2;
  puVar6[1] = 0;
  *(undefined1 *)puVar2 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_2e0 = *puVar7;
    lStack_2d8 = plVar5[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar7;
    local_2f0 = (ulong *)*plVar5;
  }
  local_2e8 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar11 = (ulong)*(uint *)(this + 1);
  cVar10 = '\x01';
  if (9 < uVar11) {
    uVar9 = uVar11;
    cVar4 = '\x04';
    do {
      cVar10 = cVar4;
      if (uVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_001e0d08;
      }
      if (uVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_001e0d08;
      }
      if (uVar9 < 10000) goto LAB_001e0d08;
      bVar3 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar4 = cVar10 + '\x04';
    } while (bVar3);
    cVar10 = cVar10 + '\x01';
  }
LAB_001e0d08:
  local_250 = local_240;
  std::__cxx11::string::_M_construct((ulong)&local_250,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_250,local_248,uVar11);
  uVar11 = CONCAT44(uStack_244,local_248) + local_2e8;
  uVar9 = 0xf;
  if (local_2f0 != &local_2e0) {
    uVar9 = local_2e0;
  }
  if (uVar9 < uVar11) {
    uVar9 = 0xf;
    if (local_250 != local_240) {
      uVar9 = local_240[0];
    }
    if (uVar11 <= uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0);
      goto LAB_001e0da2;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_250);
LAB_001e0da2:
  local_310 = &local_300;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_300 = *plVar5;
    lStack_2f8 = puVar6[3];
  }
  else {
    local_300 = *plVar5;
    local_310 = (long *)*puVar6;
  }
  local_308 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_310);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_198 = *plVar8;
    lStack_190 = plVar5[3];
    local_1a8 = &local_198;
  }
  else {
    local_198 = *plVar8;
    local_1a8 = (long *)*plVar5;
  }
  local_1a0 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1a8);
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string error_to_message(z_stream* zstrm_p, int ret) {
    std::string msg = "zlib: ";
    switch (ret) {
      case Z_STREAM_ERROR:
        msg += "Z_STREAM_ERROR: ";
        break;
      case Z_DATA_ERROR:
        msg += "Z_DATA_ERROR: ";
        break;
      case Z_MEM_ERROR:
        msg += "Z_MEM_ERROR: ";
        break;
      case Z_VERSION_ERROR:
        msg += "Z_VERSION_ERROR: ";
        break;
      case Z_BUF_ERROR:
        msg += "Z_BUF_ERROR: ";
        break;
      default:
        std::ostringstream oss;
        oss << ret;
        msg += "[" + oss.str() + "]: ";
        break;
    }
    if (zstrm_p->msg) {
      msg += zstrm_p->msg;
    }
    msg +=
        " ("
        "next_in: " +
        std::to_string(uintptr_t(zstrm_p->next_in)) +
        ", avail_in: " + std::to_string(uintptr_t(zstrm_p->avail_in)) +
        ", next_out: " + std::to_string(uintptr_t(zstrm_p->next_out)) +
        ", avail_out: " + std::to_string(uintptr_t(zstrm_p->avail_out)) + ")";
    return msg;
  }